

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashrate.cpp
# Opt level: O0

double __thiscall xmrig::Hashrate::calc(Hashrate *this,size_t ms)

{
  bool bVar1;
  ulong *in_RDI;
  double __x;
  size_t i;
  double data;
  double result;
  Hashrate *in_stack_00000038;
  undefined8 local_28;
  undefined8 local_18;
  
  local_18 = 0.0;
  for (local_28 = 0; local_28 < *in_RDI; local_28 = local_28 + 1) {
    __x = calc(in_stack_00000038,(size_t)this,ms);
    bVar1 = std::isnormal(__x);
    if (bVar1) {
      local_18 = __x + local_18;
    }
  }
  return local_18;
}

Assistant:

double xmrig::Hashrate::calc(size_t ms) const
{
    double result = 0.0;
    double data;

    for (size_t i = 0; i < m_threads; ++i) {
        data = calc(i, ms);
        if (std::isnormal(data)) {
            result += data;
        }
    }

    return result;
}